

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O2

any * shadow::pointer_detail::generic_dereference_bind_point<b>
                (any *__return_storage_ptr__,any *value)

{
  holder_base *phVar1;
  
  phVar1 = (holder_base *)((long)&value->field_1 + 8);
  if (value->on_heap_ != false) {
    phVar1 = (value->field_1).heap + 1;
  }
  any::any<b&,void,void>(__return_storage_ptr__,(b *)phVar1->_vptr_holder_base);
  return __return_storage_ptr__;
}

Assistant:

inline any
generic_dereference_bind_point(any& value)
{
    return any(*(value.get<T*>()));
}